

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.cpp
# Opt level: O0

void flatbuffers::anon_unknown_7::GenerateRegion
               (ostream *os,BinaryRegion *region,BinarySection *section,uint8_t *binary,
               OutputConfig *output_config)

{
  byte bVar1;
  ostream *poVar2;
  ulong local_c0;
  uint64_t j;
  string local_98;
  ulong local_68;
  uint64_t i;
  DocContinuation doc_continuation;
  bool doc_generated;
  OutputConfig *output_config_local;
  uint8_t *binary_local;
  BinarySection *section_local;
  BinaryRegion *region_local;
  ostream *os_local;
  
  doc_continuation.value.field_2._M_local_buf[0xf] = '\0';
  DocContinuation::DocContinuation((DocContinuation *)&i);
  for (local_68 = 0; local_68 < region->length; local_68 = local_68 + 1) {
    if (local_68 % output_config->max_bytes_per_line == 0) {
      std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<(os,"  +0x");
      ToHex<unsigned_long>(&local_98,region->offset + local_68,output_config->offset_max_char);
      std::operator<<(poVar2,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      poVar2 = std::operator<<(os," ");
      std::operator<<(poVar2,output_config->delimiter);
    }
    poVar2 = std::operator<<(os," ");
    ToHex_abi_cxx11_((string *)&j,(flatbuffers *)(ulong)binary[region->offset + local_68],
                     (uint8_t)local_68);
    std::operator<<(poVar2,(string *)&j);
    std::__cxx11::string::~string((string *)&j);
    if (((local_68 + 1) % output_config->max_bytes_per_line == 0) ||
       (local_68 + 1 == region->length)) {
      local_c0 = local_68;
      if (local_68 + 1 == region->length) {
        while (local_c0 = local_c0 + 1, local_c0 % output_config->max_bytes_per_line != 0) {
          std::operator<<(os,"   ");
        }
      }
      poVar2 = std::operator<<(os," ");
      std::operator<<(poVar2,output_config->delimiter);
      if ((doc_continuation.value.field_2._M_local_buf[0xf] & 1U) == 0) {
        std::operator<<(os," ");
        GenerateDocumentation(os,region,section,binary,(DocContinuation *)&i,output_config);
        bVar1 = std::__cxx11::string::empty();
        doc_continuation.value.field_2._M_local_buf[0xf] = bVar1 & 1;
      }
    }
  }
  DocContinuation::~DocContinuation((DocContinuation *)&i);
  return;
}

Assistant:

static void GenerateRegion(std::ostream &os, const BinaryRegion &region,
                           const BinarySection &section, const uint8_t *binary,
                           const OutputConfig &output_config) {
  bool doc_generated = false;
  DocContinuation doc_continuation;
  for (uint64_t i = 0; i < region.length; ++i) {
    if ((i % output_config.max_bytes_per_line) == 0) {
      // Start a new line of output
      os << std::endl;
      os << "  +0x" << ToHex(region.offset + i, output_config.offset_max_char);
      os << " " << output_config.delimiter;
    }

    // Add each byte
    os << " " << ToHex(binary[region.offset + i]);

    // Check for end of line or end of region conditions.
    if (((i + 1) % output_config.max_bytes_per_line == 0) ||
        i + 1 == region.length) {
      if (i + 1 == region.length) {
        // We are out of bytes but haven't the kMaxBytesPerLine, so we need to
        // zero those out to align everything globally.
        for (uint64_t j = i + 1; (j % output_config.max_bytes_per_line) != 0;
             ++j) {
          os << "   ";
        }
      }
      os << " " << output_config.delimiter;
      // This is the end of the first line or its the last byte of the region,
      // generate the end-of-line documentation.
      if (!doc_generated) {
        os << " ";
        GenerateDocumentation(os, region, section, binary, doc_continuation,
                              output_config);

        // If we have a value in the doc continuation, that means the doc is
        // being printed on multiple lines.
        doc_generated = doc_continuation.value.empty();
      }
    }
  }
}